

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_fp16s.h
# Opt level: O0

void ncnn::innerproduct_fp16s_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_fp16,Mat *bias_data,
               int activation_type,Mat *activation_params,Option *opt)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  int iVar61;
  undefined8 *puVar62;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  long *in_R9;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float *outptr;
  __m256 _w;
  __m256 _val;
  __m256 _w3_1;
  __m256 _val3_1;
  __m256 _w2_1;
  __m256 _val2_1;
  __m256i _w23_1;
  __m256 _w1_1;
  __m256 _val1_1;
  __m256 _w0_1;
  __m256 _val0_1;
  __m256i _w01_1;
  __m256 _w7;
  __m128i _w7_fp16;
  __m256 _val7;
  __m256 _w6;
  __m128i _w6_fp16;
  __m256 _val6;
  __m256i _w67;
  __m256 _w5;
  __m128i _w5_fp16;
  __m256 _val5;
  __m256 _w4;
  __m128i _w4_fp16;
  __m256 _val4;
  __m256i _w45;
  __m256 _w3;
  __m128i _w3_fp16;
  __m256 _val3;
  __m256 _w2;
  __m128i _w2_fp16;
  __m256 _val2;
  __m256i _w23;
  __m256 _w1;
  __m128i _w1_fp16;
  __m256 _val1;
  __m256 _w0;
  __m128i _w0_fp16;
  __m256 _val0;
  __m256i _w01;
  int i;
  float *sptr;
  unsigned_short *kptr;
  __m256 _sum7;
  __m256 _sum6;
  __m256 _sum5;
  __m256 _sum4;
  __m256 _sum3;
  __m256 _sum2;
  __m256 _sum1;
  __m256 _sum0;
  int p;
  float *bias_data_ptr;
  int num_output;
  int num_input;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_2;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  ulong uStack_6098;
  int local_5af4;
  float *local_5af0;
  undefined1 (*local_5ae8) [32];
  float local_5ae0;
  float fStack_5adc;
  float fStack_5ad8;
  float fStack_5ad4;
  float fStack_5ad0;
  float fStack_5acc;
  float fStack_5ac8;
  float fStack_5ac4;
  float local_5ac0;
  float fStack_5abc;
  float fStack_5ab8;
  float fStack_5ab4;
  float fStack_5ab0;
  float fStack_5aac;
  float fStack_5aa8;
  float fStack_5aa4;
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  float fStack_5a84;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  float local_5a40;
  float fStack_5a3c;
  float fStack_5a38;
  float fStack_5a34;
  float fStack_5a30;
  float fStack_5a2c;
  float fStack_5a28;
  float fStack_5a24;
  float local_5a20;
  float fStack_5a1c;
  float fStack_5a18;
  float fStack_5a14;
  float fStack_5a10;
  float fStack_5a0c;
  float fStack_5a08;
  float fStack_5a04;
  undefined8 local_5a00;
  undefined8 uStack_59f8;
  undefined8 uStack_59f0;
  undefined8 uStack_59e8;
  int local_59d4;
  float local_5420;
  float fStack_541c;
  float fStack_5418;
  float fStack_5414;
  float fStack_5410;
  float fStack_540c;
  float fStack_5408;
  float fStack_5404;
  float local_4f60;
  float fStack_4f5c;
  float fStack_4f58;
  float fStack_4f54;
  float fStack_4f50;
  float fStack_4f4c;
  float fStack_4f48;
  float fStack_4f44;
  float local_4d60;
  float fStack_4d5c;
  float fStack_4d58;
  float fStack_4d54;
  float fStack_4d50;
  float fStack_4d4c;
  float fStack_4d48;
  float fStack_4d44;
  float local_4c60;
  float fStack_4c5c;
  float fStack_4c58;
  float fStack_4c54;
  float fStack_4c50;
  float fStack_4c4c;
  float fStack_4c48;
  float fStack_4c44;
  undefined1 local_49a0 [8];
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  ulong uStack_4978;
  float local_4900;
  float fStack_48fc;
  float fStack_48f8;
  float fStack_48f4;
  float fStack_48f0;
  float fStack_48ec;
  float fStack_48e8;
  float fStack_48e4;
  float local_48c0;
  float fStack_48bc;
  float fStack_48b8;
  float fStack_48b4;
  float fStack_48b0;
  float fStack_48ac;
  float fStack_48a8;
  float fStack_48a4;
  float local_4880;
  float fStack_487c;
  float fStack_4878;
  float fStack_4874;
  float fStack_4870;
  float fStack_486c;
  float fStack_4868;
  float fStack_4864;
  float local_4840;
  float fStack_483c;
  float fStack_4838;
  float fStack_4834;
  float fStack_4830;
  float fStack_482c;
  float fStack_4828;
  float fStack_4824;
  float local_4800;
  float fStack_47fc;
  float fStack_47f8;
  float fStack_47f4;
  float fStack_47f0;
  float fStack_47ec;
  float fStack_47e8;
  float fStack_47e4;
  float local_47c0;
  float fStack_47bc;
  float fStack_47b8;
  float fStack_47b4;
  float fStack_47b0;
  float fStack_47ac;
  float fStack_47a8;
  float fStack_47a4;
  float local_4780;
  float fStack_477c;
  float fStack_4778;
  float fStack_4774;
  float fStack_4770;
  float fStack_476c;
  float fStack_4768;
  float fStack_4764;
  float local_4740;
  float fStack_473c;
  float fStack_4738;
  float fStack_4734;
  float fStack_4730;
  float fStack_472c;
  float fStack_4728;
  float local_4700;
  float fStack_46fc;
  float fStack_46f8;
  float fStack_46f4;
  float fStack_46f0;
  float fStack_46ec;
  float fStack_46e8;
  float fStack_46e4;
  float local_46c0;
  float fStack_46bc;
  float fStack_46b8;
  float fStack_46b4;
  float fStack_46b0;
  float fStack_46ac;
  float fStack_46a8;
  float fStack_46a4;
  float local_4680;
  float fStack_467c;
  float fStack_4678;
  float fStack_4674;
  float fStack_4670;
  float fStack_466c;
  float fStack_4668;
  float fStack_4664;
  float local_4640;
  float fStack_463c;
  float fStack_4638;
  float fStack_4634;
  float fStack_4630;
  float fStack_462c;
  float fStack_4628;
  float local_4600;
  float fStack_45fc;
  float fStack_45f8;
  float fStack_45f4;
  float fStack_45f0;
  float fStack_45ec;
  float fStack_45e8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_4570;
  undefined8 uStack_4568;
  float local_4300;
  float fStack_42fc;
  float fStack_42f8;
  float fStack_42f4;
  float fStack_42f0;
  float fStack_42ec;
  float fStack_42e8;
  float fStack_42e4;
  float local_42e0;
  float fStack_42dc;
  float fStack_42d8;
  float fStack_42d4;
  float fStack_42d0;
  float fStack_42cc;
  float fStack_42c8;
  float local_42c0;
  float fStack_42bc;
  float fStack_42b8;
  float fStack_42b4;
  float fStack_42b0;
  float fStack_42ac;
  float fStack_42a8;
  float fStack_42a4;
  ulong uStack_40f8;
  float local_40a0;
  float fStack_409c;
  float fStack_4098;
  float fStack_4094;
  float fStack_4090;
  float fStack_408c;
  float fStack_4088;
  float fStack_4084;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  float local_4000;
  float fStack_3ffc;
  float fStack_3ff8;
  float fStack_3ff4;
  float fStack_3ff0;
  float fStack_3fec;
  float fStack_3fe8;
  float fStack_3fe4;
  float local_3fc0;
  float fStack_3fbc;
  float fStack_3fb8;
  float fStack_3fb4;
  float fStack_3fb0;
  float fStack_3fac;
  float fStack_3fa8;
  undefined1 local_3f20 [8];
  float fStack_3f18;
  float fStack_3f14;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  float local_3e20;
  float fStack_3e1c;
  float fStack_3e18;
  float fStack_3e14;
  float fStack_3e10;
  float fStack_3e0c;
  float fStack_3e08;
  float fStack_3e04;
  float local_3de0;
  float fStack_3ddc;
  float fStack_3dd8;
  float fStack_3dd4;
  float fStack_3dd0;
  float fStack_3dcc;
  float fStack_3dc8;
  float fStack_3dc4;
  float local_3d80;
  float fStack_3d7c;
  float fStack_3d78;
  float fStack_3d74;
  float fStack_3d70;
  float fStack_3d6c;
  float fStack_3d68;
  undefined4 uStack_3d64;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined1 local_3bc0 [8];
  float fStack_3bb8;
  float fStack_3bb4;
  float fStack_3bb0;
  float fStack_3bac;
  float fStack_3ba8;
  undefined4 uStack_3ba4;
  undefined1 local_3b80 [16];
  float local_3680;
  float fStack_367c;
  float fStack_3678;
  float fStack_3674;
  float fStack_3670;
  float fStack_366c;
  float fStack_3668;
  float local_34e0;
  float fStack_34dc;
  float fStack_34d8;
  float fStack_34d4;
  float fStack_34d0;
  float fStack_34cc;
  float fStack_34c8;
  float local_3480;
  float fStack_347c;
  float fStack_3478;
  float fStack_3474;
  float fStack_3470;
  float fStack_346c;
  float fStack_3468;
  float fStack_3464;
  undefined8 local_3360;
  undefined8 uStack_3358;
  undefined8 uStack_3350;
  undefined8 uStack_3348;
  undefined1 local_3340 [8];
  float fStack_3338;
  float fStack_3334;
  float fStack_3330;
  float fStack_332c;
  float fStack_3328;
  undefined4 uStack_3324;
  float local_2e00;
  float fStack_2dfc;
  float fStack_2df8;
  float fStack_2df4;
  float fStack_2df0;
  float fStack_2dec;
  float fStack_2de8;
  float local_2c60;
  float fStack_2c5c;
  float fStack_2c58;
  float fStack_2c54;
  float fStack_2c50;
  float fStack_2c4c;
  float fStack_2c48;
  float local_2c00;
  float fStack_2bfc;
  float fStack_2bf8;
  float fStack_2bf4;
  float fStack_2bf0;
  float fStack_2bec;
  float fStack_2be8;
  float fStack_2be4;
  float local_28c0;
  float fStack_28bc;
  float fStack_28b8;
  float fStack_28b4;
  float fStack_28b0;
  float fStack_28ac;
  float fStack_28a8;
  float fStack_28a4;
  float local_2700;
  float fStack_26fc;
  float fStack_26f8;
  float fStack_26f4;
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  float local_2100;
  float fStack_20fc;
  float fStack_20f8;
  float fStack_20f4;
  float fStack_20f0;
  float fStack_20ec;
  float fStack_20e8;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  undefined4 uStack_20a4;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  float fStack_1f64;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [8];
  float fStack_1e38;
  float fStack_1e34;
  float fStack_1e30;
  float fStack_1e2c;
  float fStack_1e28;
  undefined4 uStack_1e24;
  float local_1900;
  float fStack_18fc;
  float fStack_18f8;
  float fStack_18f4;
  float fStack_18f0;
  float fStack_18ec;
  float fStack_18e8;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float local_1700;
  float fStack_16fc;
  float fStack_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  float fStack_16e8;
  float fStack_16e4;
  float local_1400;
  float fStack_13fc;
  float fStack_13f8;
  float fStack_13f4;
  float fStack_13f0;
  float fStack_13ec;
  float fStack_13e8;
  float fStack_13e4;
  undefined1 local_1120 [8];
  float fStack_1118;
  float fStack_1114;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_10a0 [8];
  float fStack_1098;
  float fStack_1094;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined1 local_1020 [8];
  float fStack_1018;
  float fStack_1014;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  float local_900;
  float fStack_8fc;
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined8 local_140;
  undefined8 uStack_138;
  
  iVar61 = *(int *)((long)in_RDI + 0x2c) * *(int *)(in_RDI + 3);
  iVar2 = *(int *)((long)in_RSI + 0x2c);
  lVar3 = *in_RCX;
  for (local_59d4 = 0; local_59d4 < iVar2; local_59d4 = local_59d4 + 1) {
    local_5a00 = 0;
    uStack_59f8 = 0;
    uStack_59f0 = 0;
    uStack_59e8 = 0;
    local_5a20 = 0.0;
    fStack_5a1c = 0.0;
    fStack_5a18 = 0.0;
    fStack_5a14 = 0.0;
    fStack_5a10 = 0.0;
    fStack_5a0c = 0.0;
    fStack_5a08 = 0.0;
    fStack_5a04 = 0.0;
    local_5a40 = 0.0;
    fStack_5a3c = 0.0;
    fStack_5a38 = 0.0;
    fStack_5a34 = 0.0;
    fStack_5a30 = 0.0;
    fStack_5a2c = 0.0;
    fStack_5a28 = 0.0;
    fStack_5a24 = 0.0;
    local_5a60 = 0.0;
    fStack_5a5c = 0.0;
    fStack_5a58 = 0.0;
    fStack_5a54 = 0.0;
    fStack_5a50 = 0.0;
    fStack_5a4c = 0.0;
    fStack_5a48 = 0.0;
    fStack_5a44 = 0.0;
    local_5a80 = 0.0;
    fStack_5a7c = 0.0;
    fStack_5a78 = 0.0;
    fStack_5a74 = 0.0;
    fStack_5a70 = 0.0;
    fStack_5a6c = 0.0;
    fStack_5a68 = 0.0;
    fStack_5a64 = 0.0;
    local_5aa0 = 0.0;
    fStack_5a9c = 0.0;
    fStack_5a98 = 0.0;
    fStack_5a94 = 0.0;
    fStack_5a90 = 0.0;
    fStack_5a8c = 0.0;
    fStack_5a88 = 0.0;
    fStack_5a84 = 0.0;
    local_5ac0 = 0.0;
    fStack_5abc = 0.0;
    fStack_5ab8 = 0.0;
    fStack_5ab4 = 0.0;
    fStack_5ab0 = 0.0;
    fStack_5aac = 0.0;
    fStack_5aa8 = 0.0;
    fStack_5aa4 = 0.0;
    local_5ae0 = 0.0;
    fStack_5adc = 0.0;
    fStack_5ad8 = 0.0;
    fStack_5ad4 = 0.0;
    fStack_5ad0 = 0.0;
    fStack_5acc = 0.0;
    fStack_5ac8 = 0.0;
    fStack_5ac4 = 0.0;
    if (lVar3 != 0) {
      puVar62 = (undefined8 *)(lVar3 + (long)(local_59d4 << 3) * 4);
      local_5a00 = *puVar62;
      uStack_59f8 = puVar62[1];
      uStack_59f0 = puVar62[2];
      uStack_59e8 = puVar62[3];
    }
    local_5ae8 = (undefined1 (*) [32])
                 (*in_RDX + (long)*(int *)((long)in_RDX + 0x2c) * (long)local_59d4 * in_RDX[2]);
    local_5af0 = (float *)*in_RDI;
    for (local_5af4 = 0; local_5af4 + 7 < iVar61; local_5af4 = local_5af4 + 8) {
      auVar10 = vlddqu_avx(*local_5ae8);
      fVar63 = *local_5af0;
      auVar13 = vcvtph2ps_f16c(auVar10._0_16_);
      local_4900 = auVar13._0_4_;
      fStack_48fc = auVar13._4_4_;
      fStack_48f8 = auVar13._8_4_;
      fStack_48f4 = auVar13._12_4_;
      fStack_48f0 = auVar13._16_4_;
      fStack_48ec = auVar13._20_4_;
      fStack_48e8 = auVar13._24_4_;
      fStack_48e4 = auVar13._28_4_;
      local_4f60 = (float)local_5a00;
      fStack_4f5c = (float)((ulong)local_5a00 >> 0x20);
      fStack_4f58 = (float)uStack_59f8;
      fStack_4f54 = (float)((ulong)uStack_59f8 >> 0x20);
      fStack_4f50 = (float)uStack_59f0;
      fStack_4f4c = (float)((ulong)uStack_59f0 >> 0x20);
      fStack_4f48 = (float)uStack_59e8;
      fStack_4f44 = (float)((ulong)uStack_59e8 >> 0x20);
      local_5a00 = CONCAT44(fVar63 * fStack_48fc + fStack_4f5c,fVar63 * local_4900 + local_4f60);
      uStack_59f8 = CONCAT44(fVar63 * fStack_48f4 + fStack_4f54,fVar63 * fStack_48f8 + fStack_4f58);
      uStack_59f0 = CONCAT44(fVar63 * fStack_48ec + fStack_4f4c,fVar63 * fStack_48f0 + fStack_4f50);
      uStack_59e8 = CONCAT44(fStack_48e4 + fStack_4f44,fVar63 * fStack_48e8 + fStack_4f48);
      fVar63 = local_5af0[1];
      auVar10 = vcvtph2ps_f16c(auVar10._16_16_);
      local_48c0 = auVar10._0_4_;
      fStack_48bc = auVar10._4_4_;
      fStack_48b8 = auVar10._8_4_;
      fStack_48b4 = auVar10._12_4_;
      fStack_48b0 = auVar10._16_4_;
      fStack_48ac = auVar10._20_4_;
      fStack_48a8 = auVar10._24_4_;
      fStack_48a4 = auVar10._28_4_;
      local_5a20 = fVar63 * local_48c0 + local_5a20;
      fStack_5a1c = fVar63 * fStack_48bc + fStack_5a1c;
      fStack_5a18 = fVar63 * fStack_48b8 + fStack_5a18;
      fStack_5a14 = fVar63 * fStack_48b4 + fStack_5a14;
      fStack_5a10 = fVar63 * fStack_48b0 + fStack_5a10;
      fStack_5a0c = fVar63 * fStack_48ac + fStack_5a0c;
      fStack_5a08 = fVar63 * fStack_48a8 + fStack_5a08;
      fStack_5a04 = fStack_48a4 + fStack_5a04;
      auVar10 = vlddqu_avx(local_5ae8[1]);
      fVar63 = local_5af0[2];
      auVar13 = vcvtph2ps_f16c(auVar10._0_16_);
      local_4880 = auVar13._0_4_;
      fStack_487c = auVar13._4_4_;
      fStack_4878 = auVar13._8_4_;
      fStack_4874 = auVar13._12_4_;
      fStack_4870 = auVar13._16_4_;
      fStack_486c = auVar13._20_4_;
      fStack_4868 = auVar13._24_4_;
      fStack_4864 = auVar13._28_4_;
      local_5a40 = fVar63 * local_4880 + local_5a40;
      fStack_5a3c = fVar63 * fStack_487c + fStack_5a3c;
      fStack_5a38 = fVar63 * fStack_4878 + fStack_5a38;
      fStack_5a34 = fVar63 * fStack_4874 + fStack_5a34;
      fStack_5a30 = fVar63 * fStack_4870 + fStack_5a30;
      fStack_5a2c = fVar63 * fStack_486c + fStack_5a2c;
      fStack_5a28 = fVar63 * fStack_4868 + fStack_5a28;
      fStack_5a24 = fStack_4864 + fStack_5a24;
      fVar63 = local_5af0[3];
      auVar10 = vcvtph2ps_f16c(auVar10._16_16_);
      local_4840 = auVar10._0_4_;
      fStack_483c = auVar10._4_4_;
      fStack_4838 = auVar10._8_4_;
      fStack_4834 = auVar10._12_4_;
      fStack_4830 = auVar10._16_4_;
      fStack_482c = auVar10._20_4_;
      fStack_4828 = auVar10._24_4_;
      fStack_4824 = auVar10._28_4_;
      local_5a60 = fVar63 * local_4840 + local_5a60;
      fStack_5a5c = fVar63 * fStack_483c + fStack_5a5c;
      fStack_5a58 = fVar63 * fStack_4838 + fStack_5a58;
      fStack_5a54 = fVar63 * fStack_4834 + fStack_5a54;
      fStack_5a50 = fVar63 * fStack_4830 + fStack_5a50;
      fStack_5a4c = fVar63 * fStack_482c + fStack_5a4c;
      fStack_5a48 = fVar63 * fStack_4828 + fStack_5a48;
      fStack_5a44 = fStack_4824 + fStack_5a44;
      auVar10 = vlddqu_avx(local_5ae8[2]);
      fVar63 = local_5af0[4];
      auVar13 = vcvtph2ps_f16c(auVar10._0_16_);
      local_4800 = auVar13._0_4_;
      fStack_47fc = auVar13._4_4_;
      fStack_47f8 = auVar13._8_4_;
      fStack_47f4 = auVar13._12_4_;
      fStack_47f0 = auVar13._16_4_;
      fStack_47ec = auVar13._20_4_;
      fStack_47e8 = auVar13._24_4_;
      fStack_47e4 = auVar13._28_4_;
      local_5a80 = fVar63 * local_4800 + local_5a80;
      fStack_5a7c = fVar63 * fStack_47fc + fStack_5a7c;
      fStack_5a78 = fVar63 * fStack_47f8 + fStack_5a78;
      fStack_5a74 = fVar63 * fStack_47f4 + fStack_5a74;
      fStack_5a70 = fVar63 * fStack_47f0 + fStack_5a70;
      fStack_5a6c = fVar63 * fStack_47ec + fStack_5a6c;
      fStack_5a68 = fVar63 * fStack_47e8 + fStack_5a68;
      fStack_5a64 = fStack_47e4 + fStack_5a64;
      fVar63 = local_5af0[5];
      auVar10 = vcvtph2ps_f16c(auVar10._16_16_);
      local_47c0 = auVar10._0_4_;
      fStack_47bc = auVar10._4_4_;
      fStack_47b8 = auVar10._8_4_;
      fStack_47b4 = auVar10._12_4_;
      fStack_47b0 = auVar10._16_4_;
      fStack_47ac = auVar10._20_4_;
      fStack_47a8 = auVar10._24_4_;
      fStack_47a4 = auVar10._28_4_;
      local_5aa0 = fVar63 * local_47c0 + local_5aa0;
      fStack_5a9c = fVar63 * fStack_47bc + fStack_5a9c;
      fStack_5a98 = fVar63 * fStack_47b8 + fStack_5a98;
      fStack_5a94 = fVar63 * fStack_47b4 + fStack_5a94;
      fStack_5a90 = fVar63 * fStack_47b0 + fStack_5a90;
      fStack_5a8c = fVar63 * fStack_47ac + fStack_5a8c;
      fStack_5a88 = fVar63 * fStack_47a8 + fStack_5a88;
      fStack_5a84 = fStack_47a4 + fStack_5a84;
      auVar10 = vlddqu_avx(local_5ae8[3]);
      fVar63 = local_5af0[6];
      auVar13 = vcvtph2ps_f16c(auVar10._0_16_);
      local_4780 = auVar13._0_4_;
      fStack_477c = auVar13._4_4_;
      fStack_4778 = auVar13._8_4_;
      fStack_4774 = auVar13._12_4_;
      fStack_4770 = auVar13._16_4_;
      fStack_476c = auVar13._20_4_;
      fStack_4768 = auVar13._24_4_;
      fStack_4764 = auVar13._28_4_;
      local_5ac0 = fVar63 * local_4780 + local_5ac0;
      fStack_5abc = fVar63 * fStack_477c + fStack_5abc;
      fStack_5ab8 = fVar63 * fStack_4778 + fStack_5ab8;
      fStack_5ab4 = fVar63 * fStack_4774 + fStack_5ab4;
      fStack_5ab0 = fVar63 * fStack_4770 + fStack_5ab0;
      fStack_5aac = fVar63 * fStack_476c + fStack_5aac;
      fStack_5aa8 = fVar63 * fStack_4768 + fStack_5aa8;
      fStack_5aa4 = fStack_4764 + fStack_5aa4;
      fVar63 = local_5af0[7];
      auVar10 = vcvtph2ps_f16c(auVar10._16_16_);
      local_4740 = auVar10._0_4_;
      fStack_473c = auVar10._4_4_;
      fStack_4738 = auVar10._8_4_;
      fStack_4734 = auVar10._12_4_;
      fStack_4730 = auVar10._16_4_;
      fStack_472c = auVar10._20_4_;
      fStack_4728 = auVar10._24_4_;
      local_5ae0 = fVar63 * local_4740 + local_5ae0;
      fStack_5adc = fVar63 * fStack_473c + fStack_5adc;
      fStack_5ad8 = fVar63 * fStack_4738 + fStack_5ad8;
      fStack_5ad4 = fVar63 * fStack_4734 + fStack_5ad4;
      fStack_5ad0 = fVar63 * fStack_4730 + fStack_5ad0;
      fStack_5acc = fVar63 * fStack_472c + fStack_5acc;
      fStack_5ac8 = fVar63 * fStack_4728 + fStack_5ac8;
      fStack_5ac4 = fVar63 + fStack_5ac4;
      local_5af0 = local_5af0 + 8;
      local_5ae8 = local_5ae8 + 4;
    }
    for (; local_5af4 + 3 < iVar61; local_5af4 = local_5af4 + 4) {
      auVar10 = vlddqu_avx(*local_5ae8);
      fVar63 = *local_5af0;
      auVar13 = vcvtph2ps_f16c(auVar10._0_16_);
      local_4700 = auVar13._0_4_;
      fStack_46fc = auVar13._4_4_;
      fStack_46f8 = auVar13._8_4_;
      fStack_46f4 = auVar13._12_4_;
      fStack_46f0 = auVar13._16_4_;
      fStack_46ec = auVar13._20_4_;
      fStack_46e8 = auVar13._24_4_;
      fStack_46e4 = auVar13._28_4_;
      local_4d60 = (float)local_5a00;
      fStack_4d5c = (float)((ulong)local_5a00 >> 0x20);
      fStack_4d58 = (float)uStack_59f8;
      fStack_4d54 = (float)((ulong)uStack_59f8 >> 0x20);
      fStack_4d50 = (float)uStack_59f0;
      fStack_4d4c = (float)((ulong)uStack_59f0 >> 0x20);
      fStack_4d48 = (float)uStack_59e8;
      fStack_4d44 = (float)((ulong)uStack_59e8 >> 0x20);
      local_5a00 = CONCAT44(fVar63 * fStack_46fc + fStack_4d5c,fVar63 * local_4700 + local_4d60);
      uStack_59f8 = CONCAT44(fVar63 * fStack_46f4 + fStack_4d54,fVar63 * fStack_46f8 + fStack_4d58);
      uStack_59f0 = CONCAT44(fVar63 * fStack_46ec + fStack_4d4c,fVar63 * fStack_46f0 + fStack_4d50);
      uStack_59e8 = CONCAT44(fStack_46e4 + fStack_4d44,fVar63 * fStack_46e8 + fStack_4d48);
      fVar63 = local_5af0[1];
      auVar10 = vcvtph2ps_f16c(auVar10._16_16_);
      local_46c0 = auVar10._0_4_;
      fStack_46bc = auVar10._4_4_;
      fStack_46b8 = auVar10._8_4_;
      fStack_46b4 = auVar10._12_4_;
      fStack_46b0 = auVar10._16_4_;
      fStack_46ac = auVar10._20_4_;
      fStack_46a8 = auVar10._24_4_;
      fStack_46a4 = auVar10._28_4_;
      local_5a20 = fVar63 * local_46c0 + local_5a20;
      fStack_5a1c = fVar63 * fStack_46bc + fStack_5a1c;
      fStack_5a18 = fVar63 * fStack_46b8 + fStack_5a18;
      fStack_5a14 = fVar63 * fStack_46b4 + fStack_5a14;
      fStack_5a10 = fVar63 * fStack_46b0 + fStack_5a10;
      fStack_5a0c = fVar63 * fStack_46ac + fStack_5a0c;
      fStack_5a08 = fVar63 * fStack_46a8 + fStack_5a08;
      fStack_5a04 = fStack_46a4 + fStack_5a04;
      auVar10 = vlddqu_avx(local_5ae8[1]);
      fVar63 = local_5af0[2];
      auVar13 = vcvtph2ps_f16c(auVar10._0_16_);
      local_4680 = auVar13._0_4_;
      fStack_467c = auVar13._4_4_;
      fStack_4678 = auVar13._8_4_;
      fStack_4674 = auVar13._12_4_;
      fStack_4670 = auVar13._16_4_;
      fStack_466c = auVar13._20_4_;
      fStack_4668 = auVar13._24_4_;
      fStack_4664 = auVar13._28_4_;
      local_5a40 = fVar63 * local_4680 + local_5a40;
      fStack_5a3c = fVar63 * fStack_467c + fStack_5a3c;
      fStack_5a38 = fVar63 * fStack_4678 + fStack_5a38;
      fStack_5a34 = fVar63 * fStack_4674 + fStack_5a34;
      fStack_5a30 = fVar63 * fStack_4670 + fStack_5a30;
      fStack_5a2c = fVar63 * fStack_466c + fStack_5a2c;
      fStack_5a28 = fVar63 * fStack_4668 + fStack_5a28;
      fStack_5a24 = fStack_4664 + fStack_5a24;
      fVar63 = local_5af0[3];
      auVar10 = vcvtph2ps_f16c(auVar10._16_16_);
      local_4640 = auVar10._0_4_;
      fStack_463c = auVar10._4_4_;
      fStack_4638 = auVar10._8_4_;
      fStack_4634 = auVar10._12_4_;
      fStack_4630 = auVar10._16_4_;
      fStack_462c = auVar10._20_4_;
      fStack_4628 = auVar10._24_4_;
      local_5a60 = fVar63 * local_4640 + local_5a60;
      fStack_5a5c = fVar63 * fStack_463c + fStack_5a5c;
      fStack_5a58 = fVar63 * fStack_4638 + fStack_5a58;
      fStack_5a54 = fVar63 * fStack_4634 + fStack_5a54;
      fStack_5a50 = fVar63 * fStack_4630 + fStack_5a50;
      fStack_5a4c = fVar63 * fStack_462c + fStack_5a4c;
      fStack_5a48 = fVar63 * fStack_4628 + fStack_5a48;
      fStack_5a44 = fVar63 + fStack_5a44;
      local_5af0 = local_5af0 + 4;
      local_5ae8 = local_5ae8 + 2;
    }
    while( true ) {
      local_4c60 = (float)local_5a00;
      fStack_4c5c = (float)((ulong)local_5a00 >> 0x20);
      fStack_4c58 = (float)uStack_59f8;
      fStack_4c54 = (float)((ulong)uStack_59f8 >> 0x20);
      fStack_4c50 = (float)uStack_59f0;
      fStack_4c4c = (float)((ulong)uStack_59f0 >> 0x20);
      fStack_4c48 = (float)uStack_59e8;
      fStack_4c44 = (float)((ulong)uStack_59e8 >> 0x20);
      if (iVar61 <= local_5af4) break;
      fVar63 = *local_5af0;
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar63),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar63),0x30);
      auVar5 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar63),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)fVar63),0x30);
      auVar9 = vlddqu_avx(*(undefined1 (*) [16])*local_5ae8);
      auVar10 = vcvtph2ps_f16c(auVar9);
      local_5420 = auVar4._0_4_;
      fStack_541c = auVar4._4_4_;
      fStack_5418 = auVar4._8_4_;
      fStack_5414 = auVar4._12_4_;
      fStack_5410 = auVar5._0_4_;
      fStack_540c = auVar5._4_4_;
      fStack_5408 = auVar5._8_4_;
      fStack_5404 = auVar5._12_4_;
      local_4600 = auVar10._0_4_;
      fStack_45fc = auVar10._4_4_;
      fStack_45f8 = auVar10._8_4_;
      fStack_45f4 = auVar10._12_4_;
      fStack_45f0 = auVar10._16_4_;
      fStack_45ec = auVar10._20_4_;
      fStack_45e8 = auVar10._24_4_;
      local_5a00 = CONCAT44(fStack_541c * fStack_45fc + fStack_4c5c,
                            local_5420 * local_4600 + local_4c60);
      uStack_59f8 = CONCAT44(fStack_5414 * fStack_45f4 + fStack_4c54,
                             fStack_5418 * fStack_45f8 + fStack_4c58);
      uStack_59f0 = CONCAT44(fStack_540c * fStack_45ec + fStack_4c4c,
                             fStack_5410 * fStack_45f0 + fStack_4c50);
      uStack_59e8 = CONCAT44(fStack_5404 + fStack_4c44,fStack_5408 * fStack_45e8 + fStack_4c48);
      local_5af0 = local_5af0 + 1;
      local_5ae8 = (undefined1 (*) [32])(*local_5ae8 + 0x10);
      local_5af4 = local_5af4 + 1;
    }
    fVar63 = local_4c60 + local_5a20 + local_5a40 + local_5a60 +
             local_5a80 + local_5aa0 + local_5ac0 + local_5ae0;
    fVar64 = fStack_4c5c + fStack_5a1c + fStack_5a3c + fStack_5a5c +
             fStack_5a7c + fStack_5a9c + fStack_5abc + fStack_5adc;
    fVar65 = fStack_4c58 + fStack_5a18 + fStack_5a38 + fStack_5a58 +
             fStack_5a78 + fStack_5a98 + fStack_5ab8 + fStack_5ad8;
    fVar66 = fStack_4c54 + fStack_5a14 + fStack_5a34 + fStack_5a54 +
             fStack_5a74 + fStack_5a94 + fStack_5ab4 + fStack_5ad4;
    fVar67 = fStack_4c50 + fStack_5a10 + fStack_5a30 + fStack_5a50 +
             fStack_5a70 + fStack_5a90 + fStack_5ab0 + fStack_5ad0;
    fVar68 = fStack_4c4c + fStack_5a0c + fStack_5a2c + fStack_5a4c +
             fStack_5a6c + fStack_5a8c + fStack_5aac + fStack_5acc;
    fVar69 = fStack_4c48 + fStack_5a08 + fStack_5a28 + fStack_5a48 +
             fStack_5a68 + fStack_5a88 + fStack_5aa8 + fStack_5ac8;
    uStack_4988._4_4_ =
         fStack_4c44 + fStack_5a04 + fStack_5a24 + fStack_5a44 +
         fStack_5a64 + fStack_5a84 + fStack_5aa4 + fStack_5ac4;
    local_5a00 = CONCAT44(fVar64,fVar63);
    uStack_59f8 = CONCAT44(fVar66,fVar65);
    uStack_59f0 = CONCAT44(fVar68,fVar67);
    uStack_59e8 = CONCAT44(uStack_4988._4_4_,fVar69);
    switch(in_R8D) {
    case 1:
      uStack_4978 = SUB328(ZEXT832(0),4);
      auVar14._8_8_ = uStack_59f8;
      auVar14._0_8_ = local_5a00;
      auVar14._16_8_ = uStack_59f0;
      auVar14._24_8_ = uStack_59e8;
      _local_49a0 = vmaxps_avx(auVar14,ZEXT832(uStack_4978) << 0x40);
      break;
    case 2:
      uVar1 = *(uint *)*in_R9;
      auVar17._8_8_ = uStack_59f8;
      auVar17._0_8_ = local_5a00;
      auVar17._16_8_ = uStack_59f0;
      auVar17._24_8_ = uStack_59e8;
      auVar10 = vmaxps_avx(ZEXT832(0),auVar17);
      auVar18._8_8_ = uStack_59f8;
      auVar18._0_8_ = local_5a00;
      auVar18._16_8_ = uStack_59f0;
      auVar18._24_8_ = uStack_59e8;
      auVar13 = vminps_avx(ZEXT832(0),auVar18);
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      local_42c0 = auVar5._0_4_;
      fStack_42bc = auVar5._4_4_;
      fStack_42b8 = auVar5._8_4_;
      fStack_42b4 = auVar5._12_4_;
      fStack_42b0 = auVar4._0_4_;
      fStack_42ac = auVar4._4_4_;
      fStack_42a8 = auVar4._8_4_;
      fStack_42a4 = auVar4._12_4_;
      local_42e0 = auVar13._0_4_;
      fStack_42dc = auVar13._4_4_;
      fStack_42d8 = auVar13._8_4_;
      fStack_42d4 = auVar13._12_4_;
      fStack_42d0 = auVar13._16_4_;
      fStack_42cc = auVar13._20_4_;
      fStack_42c8 = auVar13._24_4_;
      local_4300 = auVar10._0_4_;
      fStack_42fc = auVar10._4_4_;
      fStack_42f8 = auVar10._8_4_;
      fStack_42f4 = auVar10._12_4_;
      fStack_42f0 = auVar10._16_4_;
      fStack_42ec = auVar10._20_4_;
      fStack_42e8 = auVar10._24_4_;
      fStack_42e4 = auVar10._28_4_;
      local_49a0._4_4_ = fStack_42fc + fStack_42bc * fStack_42dc;
      local_49a0._0_4_ = local_4300 + local_42c0 * local_42e0;
      uStack_4998._0_4_ = fStack_42f8 + fStack_42b8 * fStack_42d8;
      uStack_4998._4_4_ = fStack_42f4 + fStack_42b4 * fStack_42d4;
      uStack_4990._0_4_ = fStack_42f0 + fStack_42b0 * fStack_42d0;
      uStack_4990._4_4_ = fStack_42ec + fStack_42ac * fStack_42cc;
      uStack_4988._0_4_ = fStack_42e8 + fStack_42a8 * fStack_42c8;
      uStack_4988._4_4_ = fStack_42e4 + fStack_42a4;
      break;
    case 3:
      uVar1 = *(uint *)*in_R9;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uStack_4570 = auVar5._0_8_;
      uStack_4568 = auVar5._8_8_;
      uVar1 = *(uint *)(*in_R9 + 4);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      auVar9 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(uVar1),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(uVar1),0x30);
      uStack_45b0 = auVar5._0_8_;
      uStack_45a8 = auVar5._8_8_;
      auVar16._8_8_ = uStack_59f8;
      auVar16._0_8_ = local_5a00;
      auVar16._16_8_ = uStack_59f0;
      auVar16._24_8_ = uStack_59e8;
      auVar15._16_8_ = uStack_4570;
      auVar15._0_16_ = auVar4;
      auVar15._24_8_ = uStack_4568;
      auVar10 = vmaxps_avx(auVar16,auVar15);
      auVar19._16_8_ = uStack_45b0;
      auVar19._0_16_ = auVar9;
      auVar19._24_8_ = uStack_45a8;
      _local_49a0 = vminps_avx(auVar10,auVar19);
      break;
    case 4:
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      uStack_4070 = auVar5._0_8_;
      uStack_4068 = auVar5._8_8_;
      uStack_40f8 = SUB328(ZEXT832(0),4);
      auVar25._8_8_ = uStack_59f8;
      auVar25._0_8_ = local_5a00;
      auVar25._16_8_ = uStack_59f0;
      auVar25._24_8_ = uStack_59e8;
      auVar10 = vsubps_avx(ZEXT832(uStack_40f8) << 0x40,auVar25);
      auVar24._8_8_ = 0x42b0c0a542b0c0a5;
      auVar24._0_8_ = 0x42b0c0a542b0c0a5;
      auVar24._16_8_ = 0x42b0c0a542b0c0a5;
      auVar24._24_8_ = 0x42b0c0a542b0c0a5;
      auVar10 = vminps_avx(auVar10,auVar24);
      auVar23._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar23._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13 = vmaxps_avx(auVar10,auVar23);
      local_2e00 = auVar13._0_4_;
      fStack_2dfc = auVar13._4_4_;
      fStack_2df8 = auVar13._8_4_;
      fStack_2df4 = auVar13._12_4_;
      fStack_2df0 = auVar13._16_4_;
      fStack_2dec = auVar13._20_4_;
      fStack_2de8 = auVar13._24_4_;
      local_3340._4_4_ = fStack_2dfc * 1.442695 + 0.5;
      local_3340._0_4_ = local_2e00 * 1.442695 + 0.5;
      fStack_3338 = fStack_2df8 * 1.442695 + 0.5;
      fStack_3334 = fStack_2df4 * 1.442695 + 0.5;
      fStack_3330 = fStack_2df0 * 1.442695 + 0.5;
      fStack_332c = fStack_2dec * 1.442695 + 0.5;
      fStack_3328 = fStack_2de8 * 1.442695 + 0.5;
      uStack_3324 = 0x3ff8aa3b;
      auVar12 = vroundps_avx(_local_3340,1);
      auVar10 = vcmpps_avx(_local_3340,auVar12,1);
      auVar26._8_8_ = 0x3f8000003f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._16_8_ = 0x3f8000003f800000;
      auVar26._24_8_ = 0x3f8000003f800000;
      auVar10 = vandps_avx(auVar10,auVar26);
      auVar10 = vsubps_avx(auVar12,auVar10);
      local_28c0 = auVar10._0_4_;
      fStack_28bc = auVar10._4_4_;
      fStack_28b8 = auVar10._8_4_;
      fStack_28b4 = auVar10._12_4_;
      fStack_28b0 = auVar10._16_4_;
      fStack_28ac = auVar10._20_4_;
      fStack_28a8 = auVar10._24_4_;
      fStack_28a4 = auVar10._28_4_;
      auVar29._4_4_ = fStack_28bc * 0.6933594;
      auVar29._0_4_ = local_28c0 * 0.6933594;
      auVar29._8_4_ = fStack_28b8 * 0.6933594;
      auVar29._12_4_ = fStack_28b4 * 0.6933594;
      auVar29._16_4_ = fStack_28b0 * 0.6933594;
      auVar29._20_4_ = fStack_28ac * 0.6933594;
      auVar29._24_4_ = fStack_28a8 * 0.6933594;
      auVar29._28_4_ = fStack_28a4;
      auVar10 = vsubps_avx(auVar13,auVar29);
      auVar28._4_4_ = fStack_28bc * -0.00021219444;
      auVar28._0_4_ = local_28c0 * -0.00021219444;
      auVar28._8_4_ = fStack_28b8 * -0.00021219444;
      auVar28._12_4_ = fStack_28b4 * -0.00021219444;
      auVar28._16_4_ = fStack_28b0 * -0.00021219444;
      auVar28._20_4_ = fStack_28ac * -0.00021219444;
      auVar28._24_4_ = fStack_28a8 * -0.00021219444;
      auVar28._28_4_ = fStack_28a4;
      auVar10 = vsubps_avx(auVar10,auVar28);
      local_2c00 = auVar10._0_4_;
      fStack_2bfc = auVar10._4_4_;
      fStack_2bf8 = auVar10._8_4_;
      fStack_2bf4 = auVar10._12_4_;
      fStack_2bf0 = auVar10._16_4_;
      fStack_2bec = auVar10._20_4_;
      fStack_2be8 = auVar10._24_4_;
      fStack_2be4 = auVar10._28_4_;
      local_3360 = CONCAT44((int)fStack_28bc,(int)local_28c0);
      uStack_3358 = CONCAT44((int)fStack_28b4,(int)fStack_28b8);
      uStack_3350 = CONCAT44((int)fStack_28ac,(int)fStack_28b0);
      uStack_3348 = CONCAT44((int)fStack_28a4,(int)fStack_28a8);
      auVar35._8_8_ = uStack_3358;
      auVar35._0_8_ = local_3360;
      auVar34._8_8_ = 0x7f0000007f;
      auVar34._0_8_ = 0x7f0000007f;
      auVar9 = vpaddd_avx(auVar35,auVar34);
      auVar33._8_8_ = uStack_3348;
      auVar33._0_8_ = uStack_3350;
      auVar32._8_8_ = 0x7f0000007f;
      auVar32._0_8_ = 0x7f0000007f;
      auVar6 = vpaddd_avx(auVar33,auVar32);
      auVar9 = vpslld_avx(auVar9,ZEXT416(0x17));
      auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
      local_2c60 = auVar9._0_4_;
      fStack_2c5c = auVar9._4_4_;
      fStack_2c58 = auVar9._8_4_;
      fStack_2c54 = auVar9._12_4_;
      fStack_2c50 = auVar6._0_4_;
      fStack_2c4c = auVar6._4_4_;
      fStack_2c48 = auVar6._8_4_;
      local_40a0 = auVar4._0_4_;
      fStack_409c = auVar4._4_4_;
      fStack_4098 = auVar4._8_4_;
      fStack_4094 = auVar4._12_4_;
      fStack_4090 = auVar5._0_4_;
      fStack_408c = auVar5._4_4_;
      fStack_4088 = auVar5._8_4_;
      fStack_4084 = auVar5._12_4_;
      auVar21._16_8_ = uStack_4070;
      auVar21._0_16_ = auVar4;
      auVar21._24_8_ = uStack_4068;
      auVar20._4_4_ =
           fStack_409c +
           ((((((fStack_2bfc * 0.00019875691 + 0.0013981999) * fStack_2bfc + 0.008333452) *
               fStack_2bfc + 0.041665796) * fStack_2bfc + 0.16666666) * fStack_2bfc + 0.5) *
            fStack_2bfc * fStack_2bfc + fStack_2bfc + 1.0) * fStack_2c5c;
      auVar20._0_4_ =
           local_40a0 +
           ((((((local_2c00 * 0.00019875691 + 0.0013981999) * local_2c00 + 0.008333452) * local_2c00
              + 0.041665796) * local_2c00 + 0.16666666) * local_2c00 + 0.5) *
            local_2c00 * local_2c00 + local_2c00 + 1.0) * local_2c60;
      auVar20._8_4_ =
           fStack_4098 +
           ((((((fStack_2bf8 * 0.00019875691 + 0.0013981999) * fStack_2bf8 + 0.008333452) *
               fStack_2bf8 + 0.041665796) * fStack_2bf8 + 0.16666666) * fStack_2bf8 + 0.5) *
            fStack_2bf8 * fStack_2bf8 + fStack_2bf8 + 1.0) * fStack_2c58;
      auVar20._12_4_ =
           fStack_4094 +
           ((((((fStack_2bf4 * 0.00019875691 + 0.0013981999) * fStack_2bf4 + 0.008333452) *
               fStack_2bf4 + 0.041665796) * fStack_2bf4 + 0.16666666) * fStack_2bf4 + 0.5) *
            fStack_2bf4 * fStack_2bf4 + fStack_2bf4 + 1.0) * fStack_2c54;
      auVar20._16_4_ =
           fStack_4090 +
           ((((((fStack_2bf0 * 0.00019875691 + 0.0013981999) * fStack_2bf0 + 0.008333452) *
               fStack_2bf0 + 0.041665796) * fStack_2bf0 + 0.16666666) * fStack_2bf0 + 0.5) *
            fStack_2bf0 * fStack_2bf0 + fStack_2bf0 + 1.0) * fStack_2c50;
      auVar20._20_4_ =
           fStack_408c +
           ((((((fStack_2bec * 0.00019875691 + 0.0013981999) * fStack_2bec + 0.008333452) *
               fStack_2bec + 0.041665796) * fStack_2bec + 0.16666666) * fStack_2bec + 0.5) *
            fStack_2bec * fStack_2bec + fStack_2bec + 1.0) * fStack_2c4c;
      auVar20._24_4_ =
           fStack_4088 +
           ((((((fStack_2be8 * 0.00019875691 + 0.0013981999) * fStack_2be8 + 0.008333452) *
               fStack_2be8 + 0.041665796) * fStack_2be8 + 0.16666666) * fStack_2be8 + 0.5) *
            fStack_2be8 * fStack_2be8 + fStack_2be8 + 1.0) * fStack_2c48;
      auVar20._28_4_ = fStack_4084 + fStack_2be4 + fStack_2be4 + 1.0;
      _local_49a0 = vdivps_avx(auVar21,auVar20);
      break;
    case 5:
      local_3b80._8_8_ = uStack_59f8;
      local_3b80._0_8_ = local_5a00;
      auVar22._16_8_ = uStack_59f0;
      auVar22._0_16_ = local_3b80;
      auVar22._24_8_ = uStack_59e8;
      auVar11._8_8_ = 0x42b0c0a542b0c0a5;
      auVar11._0_8_ = 0x42b0c0a542b0c0a5;
      auVar11._16_8_ = 0x42b0c0a542b0c0a5;
      auVar11._24_8_ = 0x42b0c0a542b0c0a5;
      auVar10 = vminps_avx(auVar22,auVar11);
      auVar12._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar12._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13 = vmaxps_avx(auVar10,auVar12);
      local_3680 = auVar13._0_4_;
      fStack_367c = auVar13._4_4_;
      fStack_3678 = auVar13._8_4_;
      fStack_3674 = auVar13._12_4_;
      fStack_3670 = auVar13._16_4_;
      fStack_366c = auVar13._20_4_;
      fStack_3668 = auVar13._24_4_;
      local_3bc0._4_4_ = fStack_367c * 1.442695 + 0.5;
      local_3bc0._0_4_ = local_3680 * 1.442695 + 0.5;
      fStack_3bb8 = fStack_3678 * 1.442695 + 0.5;
      fStack_3bb4 = fStack_3674 * 1.442695 + 0.5;
      fStack_3bb0 = fStack_3670 * 1.442695 + 0.5;
      fStack_3bac = fStack_366c * 1.442695 + 0.5;
      fStack_3ba8 = fStack_3668 * 1.442695 + 0.5;
      uStack_3ba4 = 0x3ff8aa3b;
      auVar12 = vroundps_avx(_local_3bc0,1);
      auVar10 = vcmpps_avx(_local_3bc0,auVar12,1);
      auVar27._8_8_ = 0x3f8000003f800000;
      auVar27._0_8_ = 0x3f8000003f800000;
      auVar27._16_8_ = 0x3f8000003f800000;
      auVar27._24_8_ = 0x3f8000003f800000;
      auVar10 = vandps_avx(auVar10,auVar27);
      auVar10 = vsubps_avx(auVar12,auVar10);
      local_2700 = auVar10._0_4_;
      fStack_26fc = auVar10._4_4_;
      fStack_26f8 = auVar10._8_4_;
      fStack_26f4 = auVar10._12_4_;
      fStack_26f0 = auVar10._16_4_;
      fStack_26ec = auVar10._20_4_;
      fStack_26e8 = auVar10._24_4_;
      fStack_26e4 = auVar10._28_4_;
      auVar31._4_4_ = fStack_26fc * 0.6933594;
      auVar31._0_4_ = local_2700 * 0.6933594;
      auVar31._8_4_ = fStack_26f8 * 0.6933594;
      auVar31._12_4_ = fStack_26f4 * 0.6933594;
      auVar31._16_4_ = fStack_26f0 * 0.6933594;
      auVar31._20_4_ = fStack_26ec * 0.6933594;
      auVar31._24_4_ = fStack_26e8 * 0.6933594;
      auVar31._28_4_ = fStack_26e4;
      auVar10 = vsubps_avx(auVar13,auVar31);
      auVar30._4_4_ = fStack_26fc * -0.00021219444;
      auVar30._0_4_ = local_2700 * -0.00021219444;
      auVar30._8_4_ = fStack_26f8 * -0.00021219444;
      auVar30._12_4_ = fStack_26f4 * -0.00021219444;
      auVar30._16_4_ = fStack_26f0 * -0.00021219444;
      auVar30._20_4_ = fStack_26ec * -0.00021219444;
      auVar30._24_4_ = fStack_26e8 * -0.00021219444;
      auVar30._28_4_ = fStack_26e4;
      auVar10 = vsubps_avx(auVar10,auVar30);
      local_3480 = auVar10._0_4_;
      fStack_347c = auVar10._4_4_;
      fStack_3478 = auVar10._8_4_;
      fStack_3474 = auVar10._12_4_;
      fStack_3470 = auVar10._16_4_;
      fStack_346c = auVar10._20_4_;
      fStack_3468 = auVar10._24_4_;
      fStack_3464 = auVar10._28_4_;
      local_3be0 = CONCAT44((int)fStack_26fc,(int)local_2700);
      uStack_3bd8 = CONCAT44((int)fStack_26f4,(int)fStack_26f8);
      uStack_3bd0 = CONCAT44((int)fStack_26ec,(int)fStack_26f0);
      uStack_3bc8 = CONCAT44((int)fStack_26e4,(int)fStack_26e8);
      auVar6._8_8_ = uStack_3bd8;
      auVar6._0_8_ = local_3be0;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar6,auVar4);
      auVar9._8_8_ = uStack_3bc8;
      auVar9._0_8_ = uStack_3bd0;
      auVar5._8_8_ = 0x7f0000007f;
      auVar5._0_8_ = 0x7f0000007f;
      auVar5 = vpaddd_avx(auVar9,auVar5);
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      auVar5 = vpslld_avx(auVar5,ZEXT416(0x17));
      local_34e0 = auVar4._0_4_;
      fStack_34dc = auVar4._4_4_;
      fStack_34d8 = auVar4._8_4_;
      fStack_34d4 = auVar4._12_4_;
      fStack_34d0 = auVar5._0_4_;
      fStack_34cc = auVar5._4_4_;
      fStack_34c8 = auVar5._8_4_;
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      uStack_6098 = SUB328(ZEXT832(0),4);
      local_4000 = auVar4._0_4_;
      fStack_3ffc = auVar4._4_4_;
      fStack_3ff8 = auVar4._8_4_;
      fStack_3ff4 = auVar4._12_4_;
      fStack_3ff0 = auVar5._0_4_;
      fStack_3fec = auVar5._4_4_;
      fStack_3fe8 = auVar5._8_4_;
      fStack_3fe4 = auVar5._12_4_;
      local_1020._4_4_ =
           ((((((fStack_347c * 0.00019875691 + 0.0013981999) * fStack_347c + 0.008333452) *
               fStack_347c + 0.041665796) * fStack_347c + 0.16666666) * fStack_347c + 0.5) *
            fStack_347c * fStack_347c + fStack_347c + 1.0) * fStack_34dc + fStack_3ffc;
      local_1020._0_4_ =
           ((((((local_3480 * 0.00019875691 + 0.0013981999) * local_3480 + 0.008333452) * local_3480
              + 0.041665796) * local_3480 + 0.16666666) * local_3480 + 0.5) *
            local_3480 * local_3480 + local_3480 + 1.0) * local_34e0 + local_4000;
      fStack_1018 = ((((((fStack_3478 * 0.00019875691 + 0.0013981999) * fStack_3478 + 0.008333452) *
                        fStack_3478 + 0.041665796) * fStack_3478 + 0.16666666) * fStack_3478 + 0.5)
                     * fStack_3478 * fStack_3478 + fStack_3478 + 1.0) * fStack_34d8 + fStack_3ff8;
      fStack_1014 = ((((((fStack_3474 * 0.00019875691 + 0.0013981999) * fStack_3474 + 0.008333452) *
                        fStack_3474 + 0.041665796) * fStack_3474 + 0.16666666) * fStack_3474 + 0.5)
                     * fStack_3474 * fStack_3474 + fStack_3474 + 1.0) * fStack_34d4 + fStack_3ff4;
      uStack_1010._0_4_ =
           ((((((fStack_3470 * 0.00019875691 + 0.0013981999) * fStack_3470 + 0.008333452) *
               fStack_3470 + 0.041665796) * fStack_3470 + 0.16666666) * fStack_3470 + 0.5) *
            fStack_3470 * fStack_3470 + fStack_3470 + 1.0) * fStack_34d0 + fStack_3ff0;
      uStack_1010._4_4_ =
           ((((((fStack_346c * 0.00019875691 + 0.0013981999) * fStack_346c + 0.008333452) *
               fStack_346c + 0.041665796) * fStack_346c + 0.16666666) * fStack_346c + 0.5) *
            fStack_346c * fStack_346c + fStack_346c + 1.0) * fStack_34cc + fStack_3fec;
      uStack_1008._0_4_ =
           ((((((fStack_3468 * 0.00019875691 + 0.0013981999) * fStack_3468 + 0.008333452) *
               fStack_3468 + 0.041665796) * fStack_3468 + 0.16666666) * fStack_3468 + 0.5) *
            fStack_3468 * fStack_3468 + fStack_3468 + 1.0) * fStack_34c8 + fStack_3fe8;
      uStack_1008._4_4_ = fStack_3464 + fStack_3464 + 1.0 + fStack_3fe4;
      auVar10 = _local_1020;
      auVar12 = vcmpps_avx(_local_1020,ZEXT832(uStack_6098) << 0x40,2);
      uStack_1008 = auVar10._24_8_;
      auVar49._16_8_ = uStack_1010;
      auVar49._0_16_ = _local_1020;
      auVar49._24_8_ = uStack_1008;
      auVar48._8_8_ = 0x80000000800000;
      auVar48._0_8_ = 0x80000000800000;
      auVar48._16_8_ = 0x80000000800000;
      auVar48._24_8_ = 0x80000000800000;
      auVar10 = vmaxps_avx(auVar49,auVar48);
      auVar4 = vpsrld_avx(auVar10._0_16_,ZEXT416(0x17));
      auVar5 = vpsrld_avx(auVar10._16_16_,ZEXT416(0x17));
      auVar53._8_8_ = 0x807fffff807fffff;
      auVar53._0_8_ = 0x807fffff807fffff;
      auVar53._16_8_ = 0x807fffff807fffff;
      auVar53._24_8_ = 0x807fffff807fffff;
      auVar10 = vandps_avx(auVar10,auVar53);
      auVar57._8_8_ = 0x3f0000003f000000;
      auVar57._0_8_ = 0x3f0000003f000000;
      auVar57._16_8_ = 0x3f0000003f000000;
      auVar57._24_8_ = 0x3f0000003f000000;
      auVar11 = vorps_avx(auVar10,auVar57);
      auVar60._8_8_ = 0x7f0000007f;
      auVar60._0_8_ = 0x7f0000007f;
      auVar4 = vpsubd_avx(auVar4,auVar60);
      auVar59._8_8_ = 0x7f0000007f;
      auVar59._0_8_ = 0x7f0000007f;
      auVar5 = vpsubd_avx(auVar5,auVar59);
      local_140 = auVar5._0_8_;
      uStack_138 = auVar5._8_8_;
      auVar58._16_8_ = local_140;
      auVar58._0_16_ = auVar4;
      auVar58._24_8_ = uStack_138;
      auVar10 = vcvtdq2ps_avx(auVar58);
      local_900 = auVar10._0_4_;
      fStack_8fc = auVar10._4_4_;
      fStack_8f8 = auVar10._8_4_;
      fStack_8f4 = auVar10._12_4_;
      fStack_8f0 = auVar10._16_4_;
      fStack_8ec = auVar10._20_4_;
      fStack_8e8 = auVar10._24_4_;
      fStack_8e4 = auVar10._28_4_;
      local_10a0._4_4_ = fStack_8fc + 1.0;
      local_10a0._0_4_ = local_900 + 1.0;
      fStack_1098 = fStack_8f8 + 1.0;
      fStack_1094 = fStack_8f4 + 1.0;
      uStack_1090._0_4_ = fStack_8f0 + 1.0;
      uStack_1090._4_4_ = fStack_8ec + 1.0;
      uStack_1088._0_4_ = fStack_8e8 + 1.0;
      uStack_1088._4_4_ = fStack_8e4 + 1.0;
      auVar22 = _local_10a0;
      auVar13 = vcmpps_avx(auVar11,_DAT_01f09ca0,1);
      auVar10 = vandps_avx(auVar11,auVar13);
      auVar51._8_8_ = 0x3f8000003f800000;
      auVar51._0_8_ = 0x3f8000003f800000;
      auVar51._16_8_ = 0x3f8000003f800000;
      auVar51._24_8_ = 0x3f8000003f800000;
      auVar11 = vsubps_avx(auVar11,auVar51);
      uStack_1088 = auVar22._24_8_;
      auVar52._8_8_ = 0x3f8000003f800000;
      auVar52._0_8_ = 0x3f8000003f800000;
      auVar52._16_8_ = 0x3f8000003f800000;
      auVar52._24_8_ = 0x3f8000003f800000;
      auVar13 = vandps_avx(auVar52,auVar13);
      auVar50._16_8_ = uStack_1090;
      auVar50._0_16_ = _local_10a0;
      auVar50._24_8_ = uStack_1088;
      auVar13 = vsubps_avx(auVar50,auVar13);
      local_940 = auVar11._0_4_;
      fStack_93c = auVar11._4_4_;
      fStack_938 = auVar11._8_4_;
      fStack_934 = auVar11._12_4_;
      fStack_930 = auVar11._16_4_;
      fStack_92c = auVar11._20_4_;
      fStack_928 = auVar11._24_4_;
      fStack_924 = auVar11._28_4_;
      local_960 = auVar10._0_4_;
      fStack_95c = auVar10._4_4_;
      fStack_958 = auVar10._8_4_;
      fStack_954 = auVar10._12_4_;
      fStack_950 = auVar10._16_4_;
      fStack_94c = auVar10._20_4_;
      fStack_948 = auVar10._24_4_;
      fStack_944 = auVar10._28_4_;
      local_940 = local_940 + local_960;
      fStack_93c = fStack_93c + fStack_95c;
      fStack_938 = fStack_938 + fStack_958;
      fStack_934 = fStack_934 + fStack_954;
      fStack_930 = fStack_930 + fStack_950;
      fStack_92c = fStack_92c + fStack_94c;
      fStack_928 = fStack_928 + fStack_948;
      fStack_924 = fStack_924 + fStack_944;
      local_6c0 = auVar13._0_4_;
      fStack_6bc = auVar13._4_4_;
      fStack_6b8 = auVar13._8_4_;
      fStack_6b4 = auVar13._12_4_;
      fStack_6b0 = auVar13._16_4_;
      fStack_6ac = auVar13._20_4_;
      fStack_6a8 = auVar13._24_4_;
      local_1120._4_4_ =
           fStack_6bc * -0.00021219444 +
           ((((((((fStack_93c * 0.070376836 + -0.1151461) * fStack_93c + 0.116769984) * fStack_93c +
                -0.12420141) * fStack_93c + 0.14249323) * fStack_93c + -0.16668057) * fStack_93c +
             0.20000714) * fStack_93c + -0.24999994) * fStack_93c + 0.3333333) * fStack_93c *
           fStack_93c * fStack_93c;
      local_1120._0_4_ =
           local_6c0 * -0.00021219444 +
           ((((((((local_940 * 0.070376836 + -0.1151461) * local_940 + 0.116769984) * local_940 +
                -0.12420141) * local_940 + 0.14249323) * local_940 + -0.16668057) * local_940 +
             0.20000714) * local_940 + -0.24999994) * local_940 + 0.3333333) * local_940 *
           local_940 * local_940;
      fStack_1118 = fStack_6b8 * -0.00021219444 +
                    ((((((((fStack_938 * 0.070376836 + -0.1151461) * fStack_938 + 0.116769984) *
                          fStack_938 + -0.12420141) * fStack_938 + 0.14249323) * fStack_938 +
                       -0.16668057) * fStack_938 + 0.20000714) * fStack_938 + -0.24999994) *
                     fStack_938 + 0.3333333) * fStack_938 * fStack_938 * fStack_938;
      fStack_1114 = fStack_6b4 * -0.00021219444 +
                    ((((((((fStack_934 * 0.070376836 + -0.1151461) * fStack_934 + 0.116769984) *
                          fStack_934 + -0.12420141) * fStack_934 + 0.14249323) * fStack_934 +
                       -0.16668057) * fStack_934 + 0.20000714) * fStack_934 + -0.24999994) *
                     fStack_934 + 0.3333333) * fStack_934 * fStack_934 * fStack_934;
      uStack_1110._0_4_ =
           fStack_6b0 * -0.00021219444 +
           ((((((((fStack_930 * 0.070376836 + -0.1151461) * fStack_930 + 0.116769984) * fStack_930 +
                -0.12420141) * fStack_930 + 0.14249323) * fStack_930 + -0.16668057) * fStack_930 +
             0.20000714) * fStack_930 + -0.24999994) * fStack_930 + 0.3333333) * fStack_930 *
           fStack_930 * fStack_930;
      uStack_1110._4_4_ =
           fStack_6ac * -0.00021219444 +
           ((((((((fStack_92c * 0.070376836 + -0.1151461) * fStack_92c + 0.116769984) * fStack_92c +
                -0.12420141) * fStack_92c + 0.14249323) * fStack_92c + -0.16668057) * fStack_92c +
             0.20000714) * fStack_92c + -0.24999994) * fStack_92c + 0.3333333) * fStack_92c *
           fStack_92c * fStack_92c;
      uStack_1108._0_4_ =
           fStack_6a8 * -0.00021219444 +
           ((((((((fStack_928 * 0.070376836 + -0.1151461) * fStack_928 + 0.116769984) * fStack_928 +
                -0.12420141) * fStack_928 + 0.14249323) * fStack_928 + -0.16668057) * fStack_928 +
             0.20000714) * fStack_928 + -0.24999994) * fStack_928 + 0.3333333) * fStack_928 *
           fStack_928 * fStack_928;
      uStack_1108._4_4_ = fStack_924 + 0.3333333 + -0.00021219444;
      auVar10 = _local_1120;
      uStack_1108 = auVar10._24_8_;
      auVar55._16_8_ = uStack_1110;
      auVar55._0_16_ = _local_1120;
      auVar55._24_8_ = uStack_1108;
      auVar54._4_4_ = fStack_93c * fStack_93c * 0.5;
      auVar54._0_4_ = local_940 * local_940 * 0.5;
      auVar54._8_4_ = fStack_938 * fStack_938 * 0.5;
      auVar54._12_4_ = fStack_934 * fStack_934 * 0.5;
      auVar54._16_4_ = fStack_930 * fStack_930 * 0.5;
      auVar54._20_4_ = fStack_92c * fStack_92c * 0.5;
      auVar54._24_4_ = fStack_928 * fStack_928 * 0.5;
      auVar54._28_4_ = fStack_924;
      auVar10 = vsubps_avx(auVar55,auVar54);
      local_9a0 = auVar10._0_4_;
      fStack_99c = auVar10._4_4_;
      fStack_998 = auVar10._8_4_;
      fStack_994 = auVar10._12_4_;
      fStack_990 = auVar10._16_4_;
      fStack_98c = auVar10._20_4_;
      fStack_988 = auVar10._24_4_;
      fStack_984 = auVar10._28_4_;
      local_1020._4_4_ = fStack_6bc * 0.6933594 + fStack_93c + fStack_99c;
      local_1020._0_4_ = local_6c0 * 0.6933594 + local_940 + local_9a0;
      fStack_1018 = fStack_6b8 * 0.6933594 + fStack_938 + fStack_998;
      fStack_1014 = fStack_6b4 * 0.6933594 + fStack_934 + fStack_994;
      uStack_1010._0_4_ = fStack_6b0 * 0.6933594 + fStack_930 + fStack_990;
      uStack_1010._4_4_ = fStack_6ac * 0.6933594 + fStack_92c + fStack_98c;
      uStack_1008._0_4_ = fStack_6a8 * 0.6933594 + fStack_928 + fStack_988;
      uStack_1008._4_4_ = fStack_924 + fStack_984 + 0.6933594;
      auVar10 = _local_1020;
      uStack_1008 = auVar10._24_8_;
      auVar56._16_8_ = uStack_1010;
      auVar56._0_16_ = _local_1020;
      auVar56._24_8_ = uStack_1008;
      auVar10 = vorps_avx(auVar56,auVar12);
      auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      uStack_2090 = auVar5._0_8_;
      uStack_2088 = auVar5._8_8_;
      auVar5 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x40000000),0x30);
      auVar9 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x40000000),0x30);
      local_20c0 = auVar10._0_4_;
      fStack_20bc = auVar10._4_4_;
      fStack_20b8 = auVar10._8_4_;
      fStack_20b4 = auVar10._12_4_;
      fStack_20b0 = auVar10._16_4_;
      fStack_20ac = auVar10._20_4_;
      fStack_20a8 = auVar10._24_4_;
      uStack_20a4 = auVar10._28_4_;
      local_20e0 = auVar5._0_4_;
      fStack_20dc = auVar5._4_4_;
      fStack_20d8 = auVar5._8_4_;
      fStack_20d4 = auVar5._12_4_;
      fStack_20d0 = auVar9._0_4_;
      fStack_20cc = auVar9._4_4_;
      fStack_20c8 = auVar9._8_4_;
      auVar5 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(0x3f800000),0x30);
      auVar9 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(0x3f800000),0x30);
      uStack_1f50 = auVar9._0_8_;
      uStack_1f48 = auVar9._8_8_;
      auVar40._4_4_ = fStack_20bc * fStack_20dc;
      auVar40._0_4_ = local_20c0 * local_20e0;
      auVar40._12_4_ = fStack_20b4 * fStack_20d4;
      auVar40._8_4_ = fStack_20b8 * fStack_20d8;
      auVar40._20_4_ = fStack_20ac * fStack_20cc;
      auVar40._16_4_ = fStack_20b0 * fStack_20d0;
      auVar40._28_4_ = uStack_20a4;
      auVar40._24_4_ = fStack_20a8 * fStack_20c8;
      auVar10 = vsubps_avx(ZEXT832(uStack_6098) << 0x40,auVar40);
      auVar39._8_8_ = 0x42b0c0a542b0c0a5;
      auVar39._0_8_ = 0x42b0c0a542b0c0a5;
      auVar39._16_8_ = 0x42b0c0a542b0c0a5;
      auVar39._24_8_ = 0x42b0c0a542b0c0a5;
      auVar10 = vminps_avx(auVar10,auVar39);
      auVar38._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar38._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar38._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar38._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar13 = vmaxps_avx(auVar10,auVar38);
      local_1900 = auVar13._0_4_;
      fStack_18fc = auVar13._4_4_;
      fStack_18f8 = auVar13._8_4_;
      fStack_18f4 = auVar13._12_4_;
      fStack_18f0 = auVar13._16_4_;
      fStack_18ec = auVar13._20_4_;
      fStack_18e8 = auVar13._24_4_;
      local_1e40._4_4_ = fStack_18fc * 1.442695 + 0.5;
      local_1e40._0_4_ = local_1900 * 1.442695 + 0.5;
      fStack_1e38 = fStack_18f8 * 1.442695 + 0.5;
      fStack_1e34 = fStack_18f4 * 1.442695 + 0.5;
      fStack_1e30 = fStack_18f0 * 1.442695 + 0.5;
      fStack_1e2c = fStack_18ec * 1.442695 + 0.5;
      fStack_1e28 = fStack_18e8 * 1.442695 + 0.5;
      uStack_1e24 = 0x3ff8aa3b;
      auVar12 = vroundps_avx(_local_1e40,1);
      auVar10 = vcmpps_avx(_local_1e40,auVar12,1);
      auVar43._8_8_ = 0x3f8000003f800000;
      auVar43._0_8_ = 0x3f8000003f800000;
      auVar43._16_8_ = 0x3f8000003f800000;
      auVar43._24_8_ = 0x3f8000003f800000;
      auVar10 = vandps_avx(auVar10,auVar43);
      auVar10 = vsubps_avx(auVar12,auVar10);
      local_1400 = auVar10._0_4_;
      fStack_13fc = auVar10._4_4_;
      fStack_13f8 = auVar10._8_4_;
      fStack_13f4 = auVar10._12_4_;
      fStack_13f0 = auVar10._16_4_;
      fStack_13ec = auVar10._20_4_;
      fStack_13e8 = auVar10._24_4_;
      fStack_13e4 = auVar10._28_4_;
      auVar45._4_4_ = fStack_13fc * 0.6933594;
      auVar45._0_4_ = local_1400 * 0.6933594;
      auVar45._8_4_ = fStack_13f8 * 0.6933594;
      auVar45._12_4_ = fStack_13f4 * 0.6933594;
      auVar45._16_4_ = fStack_13f0 * 0.6933594;
      auVar45._20_4_ = fStack_13ec * 0.6933594;
      auVar45._24_4_ = fStack_13e8 * 0.6933594;
      auVar45._28_4_ = fStack_13e4;
      auVar10 = vsubps_avx(auVar13,auVar45);
      auVar44._4_4_ = fStack_13fc * -0.00021219444;
      auVar44._0_4_ = local_1400 * -0.00021219444;
      auVar44._8_4_ = fStack_13f8 * -0.00021219444;
      auVar44._12_4_ = fStack_13f4 * -0.00021219444;
      auVar44._16_4_ = fStack_13f0 * -0.00021219444;
      auVar44._20_4_ = fStack_13ec * -0.00021219444;
      auVar44._24_4_ = fStack_13e8 * -0.00021219444;
      auVar44._28_4_ = fStack_13e4;
      auVar10 = vsubps_avx(auVar10,auVar44);
      local_1700 = auVar10._0_4_;
      fStack_16fc = auVar10._4_4_;
      fStack_16f8 = auVar10._8_4_;
      fStack_16f4 = auVar10._12_4_;
      fStack_16f0 = auVar10._16_4_;
      fStack_16ec = auVar10._20_4_;
      fStack_16e8 = auVar10._24_4_;
      fStack_16e4 = auVar10._28_4_;
      local_1e60 = CONCAT44((int)fStack_13fc,(int)local_1400);
      uStack_1e58 = CONCAT44((int)fStack_13f4,(int)fStack_13f8);
      uStack_1e50 = CONCAT44((int)fStack_13ec,(int)fStack_13f0);
      uStack_1e48 = CONCAT44((int)fStack_13e4,(int)fStack_13e8);
      auVar47._8_8_ = uStack_1e58;
      auVar47._0_8_ = local_1e60;
      auVar46._8_8_ = 0x7f0000007f;
      auVar46._0_8_ = 0x7f0000007f;
      auVar6 = vpaddd_avx(auVar47,auVar46);
      auVar8._8_8_ = uStack_1e48;
      auVar8._0_8_ = uStack_1e50;
      auVar7._8_8_ = 0x7f0000007f;
      auVar7._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar8,auVar7);
      auVar6 = vpslld_avx(auVar6,ZEXT416(0x17));
      auVar7 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_1760 = auVar6._0_4_;
      fStack_175c = auVar6._4_4_;
      fStack_1758 = auVar6._8_4_;
      fStack_1754 = auVar6._12_4_;
      fStack_1750 = auVar7._0_4_;
      fStack_174c = auVar7._4_4_;
      fStack_1748 = auVar7._8_4_;
      local_1f80 = auVar5._0_4_;
      fStack_1f7c = auVar5._4_4_;
      fStack_1f78 = auVar5._8_4_;
      fStack_1f74 = auVar5._12_4_;
      fStack_1f70 = auVar9._0_4_;
      fStack_1f6c = auVar9._4_4_;
      fStack_1f68 = auVar9._8_4_;
      fStack_1f64 = auVar9._12_4_;
      auVar37._16_8_ = uStack_1f50;
      auVar37._0_16_ = auVar5;
      auVar37._24_8_ = uStack_1f48;
      auVar36._4_4_ =
           fStack_1f7c +
           (((((fStack_16fc * (fStack_16fc * 0.00019875691 + 0.0013981999) + 0.008333452) *
               fStack_16fc + 0.041665796) * fStack_16fc + 0.16666666) * fStack_16fc + 0.5) *
            fStack_16fc * fStack_16fc + fStack_16fc + 1.0) * fStack_175c;
      auVar36._0_4_ =
           local_1f80 +
           (((((local_1700 * (local_1700 * 0.00019875691 + 0.0013981999) + 0.008333452) * local_1700
              + 0.041665796) * local_1700 + 0.16666666) * local_1700 + 0.5) *
            local_1700 * local_1700 + local_1700 + 1.0) * local_1760;
      auVar36._8_4_ =
           fStack_1f78 +
           (((((fStack_16f8 * (fStack_16f8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
               fStack_16f8 + 0.041665796) * fStack_16f8 + 0.16666666) * fStack_16f8 + 0.5) *
            fStack_16f8 * fStack_16f8 + fStack_16f8 + 1.0) * fStack_1758;
      auVar36._12_4_ =
           fStack_1f74 +
           (((((fStack_16f4 * (fStack_16f4 * 0.00019875691 + 0.0013981999) + 0.008333452) *
               fStack_16f4 + 0.041665796) * fStack_16f4 + 0.16666666) * fStack_16f4 + 0.5) *
            fStack_16f4 * fStack_16f4 + fStack_16f4 + 1.0) * fStack_1754;
      auVar36._16_4_ =
           fStack_1f70 +
           (((((fStack_16f0 * (fStack_16f0 * 0.00019875691 + 0.0013981999) + 0.008333452) *
               fStack_16f0 + 0.041665796) * fStack_16f0 + 0.16666666) * fStack_16f0 + 0.5) *
            fStack_16f0 * fStack_16f0 + fStack_16f0 + 1.0) * fStack_1750;
      auVar36._20_4_ =
           fStack_1f6c +
           (((((fStack_16ec * (fStack_16ec * 0.00019875691 + 0.0013981999) + 0.008333452) *
               fStack_16ec + 0.041665796) * fStack_16ec + 0.16666666) * fStack_16ec + 0.5) *
            fStack_16ec * fStack_16ec + fStack_16ec + 1.0) * fStack_174c;
      auVar36._24_4_ =
           fStack_1f68 +
           (((((fStack_16e8 * (fStack_16e8 * 0.00019875691 + 0.0013981999) + 0.008333452) *
               fStack_16e8 + 0.041665796) * fStack_16e8 + 0.16666666) * fStack_16e8 + 0.5) *
            fStack_16e8 * fStack_16e8 + fStack_16e8 + 1.0) * fStack_1748;
      auVar36._28_4_ = fStack_1f64 + fStack_16e4 + fStack_16e4 + 1.0;
      auVar10 = vdivps_avx(auVar37,auVar36);
      local_2100 = auVar10._0_4_;
      fStack_20fc = auVar10._4_4_;
      fStack_20f8 = auVar10._8_4_;
      fStack_20f4 = auVar10._12_4_;
      fStack_20f0 = auVar10._16_4_;
      fStack_20ec = auVar10._20_4_;
      fStack_20e8 = auVar10._24_4_;
      auVar42._4_4_ = fStack_20fc * fStack_20dc;
      auVar42._0_4_ = local_2100 * local_20e0;
      auVar42._8_4_ = fStack_20f8 * fStack_20d8;
      auVar42._12_4_ = fStack_20f4 * fStack_20d4;
      auVar42._16_4_ = fStack_20f0 * fStack_20d0;
      auVar42._20_4_ = fStack_20ec * fStack_20cc;
      auVar42._24_4_ = fStack_20e8 * fStack_20c8;
      auVar42._28_4_ = auVar10._28_4_;
      auVar41._16_8_ = uStack_2090;
      auVar41._0_16_ = auVar4;
      auVar41._24_8_ = uStack_2088;
      auVar10 = vsubps_avx(auVar42,auVar41);
      local_3fc0 = auVar10._0_4_;
      fStack_3fbc = auVar10._4_4_;
      fStack_3fb8 = auVar10._8_4_;
      fStack_3fb4 = auVar10._12_4_;
      fStack_3fb0 = auVar10._16_4_;
      fStack_3fac = auVar10._20_4_;
      fStack_3fa8 = auVar10._24_4_;
      local_49a0._4_4_ = fVar64 * fStack_3fbc;
      local_49a0._0_4_ = fVar63 * local_3fc0;
      uStack_4998._0_4_ = fVar65 * fStack_3fb8;
      uStack_4998._4_4_ = fVar66 * fStack_3fb4;
      uStack_4990._0_4_ = fVar67 * fStack_3fb0;
      uStack_4990._4_4_ = fVar68 * fStack_3fac;
      uStack_4988._0_4_ = fVar69 * fStack_3fa8;
      break;
    case 6:
      uVar1 = *(uint *)*in_R9;
      auVar4 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416(uVar1),0x30);
      auVar5 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x20);
      auVar5 = vinsertps_avx(auVar5,ZEXT416(uVar1),0x30);
      uVar1 = *(uint *)(*in_R9 + 4);
      auVar9 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(uVar1),0x20);
      auVar9 = vinsertps_avx(auVar9,ZEXT416(uVar1),0x30);
      auVar6 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x20);
      auVar6 = vinsertps_avx(auVar6,ZEXT416(uVar1),0x30);
      auVar7 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x20);
      auVar7 = vinsertps_avx(auVar7,ZEXT416(0x3f800000),0x30);
      auVar8 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x20);
      auVar8 = vinsertps_avx(auVar8,ZEXT416(0x3f800000),0x30);
      uStack_3d50 = auVar8._0_8_;
      uStack_3d48 = auVar8._8_8_;
      local_3de0 = auVar4._0_4_;
      fStack_3ddc = auVar4._4_4_;
      fStack_3dd8 = auVar4._8_4_;
      fStack_3dd4 = auVar4._12_4_;
      fStack_3dd0 = auVar5._0_4_;
      fStack_3dcc = auVar5._4_4_;
      fStack_3dc8 = auVar5._8_4_;
      fStack_3dc4 = auVar5._12_4_;
      local_3e20 = auVar9._0_4_;
      fStack_3e1c = auVar9._4_4_;
      fStack_3e18 = auVar9._8_4_;
      fStack_3e14 = auVar9._12_4_;
      fStack_3e10 = auVar6._0_4_;
      fStack_3e0c = auVar6._4_4_;
      fStack_3e08 = auVar6._8_4_;
      fStack_3e04 = auVar6._12_4_;
      local_3f20._4_4_ = fVar64 * fStack_3ddc + fStack_3e1c;
      local_3f20._0_4_ = fVar63 * local_3de0 + local_3e20;
      fStack_3f18 = fVar65 * fStack_3dd8 + fStack_3e18;
      fStack_3f14 = fVar66 * fStack_3dd4 + fStack_3e14;
      uStack_3f10._0_4_ = fVar67 * fStack_3dd0 + fStack_3e10;
      uStack_3f10._4_4_ = fVar68 * fStack_3dcc + fStack_3e0c;
      uStack_3f08._0_4_ = fVar69 * fStack_3dc8 + fStack_3e08;
      uStack_3f08._4_4_ = fStack_3dc4 + fStack_3e04;
      auVar10 = _local_3f20;
      uStack_3f08 = auVar10._24_8_;
      auVar10._16_8_ = uStack_3f10;
      auVar10._0_16_ = _local_3f20;
      auVar10._24_8_ = uStack_3f08;
      auVar10 = vmaxps_avx(auVar10,ZEXT832(0));
      auVar13._16_8_ = uStack_3d50;
      auVar13._0_16_ = auVar7;
      auVar13._24_8_ = uStack_3d48;
      auVar10 = vminps_avx(auVar10,auVar13);
      local_3d80 = auVar10._0_4_;
      fStack_3d7c = auVar10._4_4_;
      fStack_3d78 = auVar10._8_4_;
      fStack_3d74 = auVar10._12_4_;
      fStack_3d70 = auVar10._16_4_;
      fStack_3d6c = auVar10._20_4_;
      fStack_3d68 = auVar10._24_4_;
      uStack_3d64 = auVar10._28_4_;
      local_49a0._4_4_ = fStack_3d7c * fVar64;
      local_49a0._0_4_ = local_3d80 * fVar63;
      uStack_4998._0_4_ = fStack_3d78 * fVar65;
      uStack_4998._4_4_ = fStack_3d74 * fVar66;
      uStack_4990._0_4_ = fStack_3d70 * fVar67;
      uStack_4990._4_4_ = fStack_3d6c * fVar68;
      uStack_4988._0_4_ = fStack_3d68 * fVar69;
      uStack_4988._4_4_ = (float)uStack_3d64;
      break;
    default:
      uStack_4998 = uStack_59f8;
      local_49a0 = (undefined1  [8])local_5a00;
      uStack_4990 = uStack_59f0;
      uStack_4988 = uStack_59e8;
    }
    puVar62 = (undefined8 *)(*in_RSI + (long)(local_59d4 << 3) * 4);
    *puVar62 = local_49a0;
    puVar62[1] = uStack_4998;
    puVar62[2] = uStack_4990;
    puVar62[3] = uStack_4988;
  }
  return;
}

Assistant:

static void innerproduct_fp16s_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_fp16, const Mat& bias_data, int activation_type, const Mat& activation_params, const Option& opt)
{
#if NCNN_RUNTIME_CPU && NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        innerproduct_fp16s_pack8_avx_f16c(bottom_blob, top_blob, weight_data_fp16, bias_data, activation_type, activation_params, opt);
        return;
    }
#endif

#if __F16C__
    const int num_input = bottom_blob.w * bottom_blob.elempack;
    const int num_output = top_blob.w;

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        __m256 _sum0 = _mm256_setzero_ps();
        __m256 _sum1 = _mm256_setzero_ps();
        __m256 _sum2 = _mm256_setzero_ps();
        __m256 _sum3 = _mm256_setzero_ps();
        __m256 _sum4 = _mm256_setzero_ps();
        __m256 _sum5 = _mm256_setzero_ps();
        __m256 _sum6 = _mm256_setzero_ps();
        __m256 _sum7 = _mm256_setzero_ps();

        if (bias_data_ptr)
        {
            _sum0 = _mm256_loadu_ps(bias_data_ptr + p * 8);
        }

        const unsigned short* kptr = weight_data_fp16.row<const unsigned short>(p);

        const float* sptr = bottom_blob;

        int i = 0;
        for (; i + 7 < num_input; i += 8)
        {
            __m256i _w01 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256 _val0 = _mm256_broadcast_ss(sptr);
            __m128i _w0_fp16 = _mm256_extractf128_si256(_w01, 0);
            __m256 _w0 = _mm256_cvtph_ps(_w0_fp16);
            _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
            __m128i _w1_fp16 = _mm256_extractf128_si256(_w01, 1);
            __m256 _w1 = _mm256_cvtph_ps(_w1_fp16);
            _sum1 = _mm256_comp_fmadd_ps(_val1, _w1, _sum1);

            __m256i _w23 = _mm256_lddqu_si256((const __m256i*)(kptr + 16));
            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
            __m128i _w2_fp16 = _mm256_extractf128_si256(_w23, 0);
            __m256 _w2 = _mm256_cvtph_ps(_w2_fp16);
            _sum2 = _mm256_comp_fmadd_ps(_val2, _w2, _sum2);

            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
            __m128i _w3_fp16 = _mm256_extractf128_si256(_w23, 1);
            __m256 _w3 = _mm256_cvtph_ps(_w3_fp16);
            _sum3 = _mm256_comp_fmadd_ps(_val3, _w3, _sum3);

            __m256i _w45 = _mm256_lddqu_si256((const __m256i*)(kptr + 32));
            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
            __m128i _w4_fp16 = _mm256_extractf128_si256(_w45, 0);
            __m256 _w4 = _mm256_cvtph_ps(_w4_fp16);
            _sum4 = _mm256_comp_fmadd_ps(_val4, _w4, _sum4);

            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
            __m128i _w5_fp16 = _mm256_extractf128_si256(_w45, 1);
            __m256 _w5 = _mm256_cvtph_ps(_w5_fp16);
            _sum5 = _mm256_comp_fmadd_ps(_val5, _w5, _sum5);

            __m256i _w67 = _mm256_lddqu_si256((const __m256i*)(kptr + 48));
            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
            __m128i _w6_fp16 = _mm256_extractf128_si256(_w67, 0);
            __m256 _w6 = _mm256_cvtph_ps(_w6_fp16);
            _sum6 = _mm256_comp_fmadd_ps(_val6, _w6, _sum6);

            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);
            __m128i _w7_fp16 = _mm256_extractf128_si256(_w67, 1);
            __m256 _w7 = _mm256_cvtph_ps(_w7_fp16);
            _sum7 = _mm256_comp_fmadd_ps(_val7, _w7, _sum7);

            sptr += 8;
            kptr += 64;
        }
        for (; i + 3 < num_input; i += 4)
        {
            __m256i _w01 = _mm256_lddqu_si256((const __m256i*)kptr);
            __m256 _val0 = _mm256_broadcast_ss(sptr);
            __m256 _w0 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w01, 0));
            _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
            __m256 _w1 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w01, 1));
            _sum1 = _mm256_comp_fmadd_ps(_val1, _w1, _sum1);

            __m256i _w23 = _mm256_lddqu_si256((const __m256i*)(kptr + 16));
            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
            __m256 _w2 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w23, 0));
            _sum2 = _mm256_comp_fmadd_ps(_val2, _w2, _sum2);

            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
            __m256 _w3 = _mm256_cvtph_ps(_mm256_extractf128_si256(_w23, 1));
            _sum3 = _mm256_comp_fmadd_ps(_val3, _w3, _sum3);

            sptr += 4;
            kptr += 32;
        }
        for (; i < num_input; i++)
        {
            __m256 _val = _mm256_set1_ps(sptr[0]);
            __m256 _w = _mm256_cvtph_ps(_mm_lddqu_si128((const __m128i*)kptr));
            _sum0 = _mm256_comp_fmadd_ps(_val, _w, _sum0);

            sptr += 1;
            kptr += 8;
        }

        _sum0 = _mm256_add_ps(_sum0, _sum1);
        _sum2 = _mm256_add_ps(_sum2, _sum3);
        _sum4 = _mm256_add_ps(_sum4, _sum5);
        _sum6 = _mm256_add_ps(_sum6, _sum7);
        _sum0 = _mm256_add_ps(_sum0, _sum2);
        _sum4 = _mm256_add_ps(_sum4, _sum6);
        _sum0 = _mm256_add_ps(_sum0, _sum4);

        _sum0 = activation_avx(_sum0, activation_type, activation_params);

        float* outptr = top_blob;
        _mm256_storeu_ps(outptr + p * 8, _sum0);
    }
#else  // __F16C__
    (void)bottom_blob;
    (void)top_blob;
    (void)weight_data_fp16;
    (void)bias_data;
    (void)activation_type;
    (void)activation_params;
    (void)opt;
#endif // __F16C__
}